

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringFormat.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
rlib::string::format<char,std::__cxx11::string&>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,string *this,char *lpszFormat,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  long *plVar1;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> format;
  allocator<char> local_121;
  undefined1 local_120 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  undefined1 local_100 [128];
  void *local_80;
  undefined8 uStack_78;
  long local_70 [4];
  locale local_50 [8];
  char *local_48;
  bool local_40;
  bool local_30;
  locale local_28 [8];
  
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
             (char *)0x0);
  local_100[0x70] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)local_120,(char *)this,&local_121);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::parse
            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
             (string_type *)local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._0_8_ != &local_110) {
    operator_delete((void *)local_120._0_8_,local_110._M_allocated_capacity + 1);
  }
  local_120._8_8_ =
       boost::io::detail::call_put_head<char,std::char_traits<char>,std::__cxx11::string>;
  local_110._M_allocated_capacity =
       (size_type)boost::io::detail::call_put_last<char,std::char_traits<char>,std::__cxx11::string>
  ;
  local_120._0_8_ = lpszFormat;
  boost::io::detail::
  feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
             (put_holder<char,_std::char_traits<char>_> *)local_120);
  boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
            (__return_storage_ptr__,local_100);
  if (local_30 == true) {
    std::locale::~locale(local_28);
    local_30 = false;
  }
  local_100._120_8_ = &PTR__basic_altstringbuf_00179be8;
  if (local_40 == true) {
    plVar1 = local_70 + 3;
    if (local_70[2] == 0) {
      plVar1 = local_70;
    }
    operator_delete(local_80,*plVar1 - (long)local_80);
  }
  local_40 = false;
  local_48 = (char *)0x0;
  local_80 = (void *)0x0;
  uStack_78 = 0;
  local_70[0] = 0;
  local_70[1] = 0;
  local_70[2] = 0;
  local_70[3] = 0;
  local_100._120_8_ = boost::program_options::detail::cmdline::cmdline;
  std::locale::~locale(local_50);
  if ((undefined1 *)local_100._80_8_ != local_100 + 0x60) {
    operator_delete((void *)local_100._80_8_,local_100._96_8_ + 1);
  }
  if ((_Bit_type *)local_100._24_8_ != (_Bit_type *)0x0) {
    operator_delete((void *)local_100._24_8_,local_100._56_8_ - local_100._24_8_);
    local_100._24_8_ = (_Bit_type *)0x0;
    local_100._32_4_ = 0;
    local_100._40_8_ = (_Bit_type *)0x0;
    local_100._48_4_ = 0;
    local_100._56_8_ = (_Bit_pointer)0x0;
  }
  std::
  vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_100);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<CharT> format(const CharT* lpszFormat, Args&&... args) {
			boost::basic_format<CharT> format;
			format.exceptions(boost::io::no_error_bits);	// 例外を発生させない
			format.parse(lpszFormat);
			try {
				inner::f<CharT>(format, args...);
			} catch (...) {
			}
			return format.str();
		}